

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_utils.c
# Opt level: O2

WORD32 ihevcd_nctb_cnt(codec_t *ps_codec,sps_t *ps_sps)

{
  return 1;
}

Assistant:

WORD32 ihevcd_nctb_cnt(codec_t *ps_codec, sps_t *ps_sps)
{
    WORD32 nctb = 1;
    UNUSED(ps_codec);
    //TODO: Currently set to 1
    /* If CTB size is less than 32 x 32 then set nCTB as 4 */
    if(ps_sps->i1_log2_ctb_size < 5)
        nctb = 1;

    return nctb;
}